

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O3

void spell_menu_browser(wchar_t oid,void *data,region_conflict *loc)

{
  wchar_t index;
  _Bool _Var1;
  uint uVar2;
  class_spell *pcVar3;
  effect *peVar4;
  char *pcVar5;
  dice_t *shared_dice;
  int iVar6;
  uint uVar7;
  
  index = *(wchar_t *)(*data + (long)oid * 4);
  pcVar3 = spell_by_index(player,index);
  if (*(char *)((long)data + 0x18) == '\x01') {
    text_out_hook = text_out_to_screen;
    text_out_wrap = L'\0';
    text_out_indent = loc->col + L'\xffffffff';
    text_out_pad = L'\x01';
    Term_gotoxy(loc->col,loc->page_rows + loc->row);
    uVar7 = 0;
    text_out("\n%s",pcVar3->text);
    peVar4 = pcVar3->effect;
    if (peVar4 != (effect *)0x0) {
      do {
        _Var1 = effect_damages(peVar4);
        uVar7 = uVar7 + _Var1;
        peVar4 = effect_next(peVar4);
      } while (peVar4 != (effect *)0x0);
      if ((uVar7 != 0) && ((player->spell_flags[index] & 6) == 2)) {
        text_out("  Inflicts an average of");
        peVar4 = pcVar3->effect;
        if (peVar4 != (effect *)0x0) {
          iVar6 = 0;
          shared_dice = (dice_t *)0x0;
          do {
            if (peVar4->index == 0x7c) {
              shared_dice = (dice_t *)0x0;
            }
            else if (peVar4->index == 0x7b) {
              shared_dice = peVar4->dice;
            }
            _Var1 = effect_damages(peVar4);
            if (_Var1) {
              if (0 < iVar6 && 2 < uVar7) {
                text_out(",");
              }
              if (iVar6 == uVar7 - 1 && uVar7 != 1) {
                text_out(" and");
              }
              uVar2 = effect_avg_damage(peVar4,shared_dice);
              text_out_c('\r'," %d",(ulong)uVar2);
              pcVar5 = effect_projection(peVar4);
              if (*pcVar5 != '\0') {
                text_out(" %s",pcVar5);
              }
              iVar6 = iVar6 + 1;
            }
            peVar4 = effect_next(peVar4);
          } while (peVar4 != (effect *)0x0);
        }
        text_out(" damage.");
      }
    }
    text_out("\n\n");
    text_out_pad = L'\0';
    text_out_indent = L'\0';
  }
  return;
}

Assistant:

static void spell_menu_browser(int oid, void *data, const region *loc)
{
	struct spell_menu_data *d = data;
	int spell_index = d->spells[oid];
	const struct class_spell *spell = spell_by_index(player, spell_index);

	if (d->show_description) {
		/* Redirect output to the screen */
		text_out_hook = text_out_to_screen;
		text_out_wrap = 0;
		text_out_indent = loc->col - 1;
		text_out_pad = 1;

		Term_gotoxy(loc->col, loc->row + loc->page_rows);
		/* Spell description */
		text_out("\n%s", spell->text);

		/* To summarize average damage, count the damaging effects */
		int num_damaging = 0;
		for (struct effect *e = spell->effect; e != NULL; e = effect_next(e)) {
			if (effect_damages(e)) {
				num_damaging++;
			}
		}
		/* Now enumerate the effects' damage and type if not forgotten */
		if (num_damaging > 0
			&& (player->spell_flags[spell_index] & PY_SPELL_WORKED)
			&& !(player->spell_flags[spell_index] & PY_SPELL_FORGOTTEN)) {
			dice_t *shared_dice = NULL;
			int i = 0;

			text_out("  Inflicts an average of");
			for (struct effect *e = spell->effect; e != NULL; e = effect_next(e)) {
				if (e->index == EF_SET_VALUE) {
					shared_dice = e->dice;
				} else if (e->index == EF_CLEAR_VALUE) {
					shared_dice = NULL;
				}
				if (effect_damages(e)) {
					if (num_damaging > 2 && i > 0) {
						text_out(",");
					}
					if (num_damaging > 1 && i == num_damaging - 1) {
						text_out(" and");
					}
					text_out_c(COLOUR_L_GREEN, " %d", effect_avg_damage(e, shared_dice));
					const char *projection = effect_projection(e);
					if (strlen(projection) > 0) {
						text_out(" %s", projection);
					}
					i++;
				}
			}
			text_out(" damage.");
		}
		text_out("\n\n");

		/* XXX */
		text_out_pad = 0;
		text_out_indent = 0;
	}
}